

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3PendingTermsAddOne(Fts3Table *p,int iCol,int iPos,Fts3Hash *pHash,char *zToken,int nToken)

{
  PendingList *p_00;
  int iVar1;
  PendingList *pPVar2;
  long in_FS_OFFSET;
  int local_44;
  PendingList *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_44 = 0;
  local_40 = (PendingList *)sqlite3Fts3HashFind(pHash,zToken,nToken);
  if (local_40 != (PendingList *)0x0) {
    p->nPendingData = (p->nPendingData - (local_40->nData + nToken)) + -0x28;
  }
  iVar1 = fts3PendingListAppend(&local_40,p->iPrevDocid,(long)iCol,(long)iPos,&local_44);
  p_00 = local_40;
  if (iVar1 != 0) {
    pPVar2 = (PendingList *)sqlite3Fts3HashInsert(pHash,zToken,nToken,local_40);
    if (p_00 == pPVar2) {
      sqlite3_free(p_00);
      iVar1 = 7;
      goto LAB_001b6fcb;
    }
  }
  iVar1 = local_44;
  if (local_44 == 0) {
    p->nPendingData = p->nPendingData + nToken + local_40->nData + 0x28;
    iVar1 = 0;
  }
LAB_001b6fcb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3PendingTermsAddOne(
  Fts3Table *p,
  int iCol,
  int iPos,
  Fts3Hash *pHash,                /* Pending terms hash table to add entry to */
  const char *zToken,
  int nToken
){
  PendingList *pList;
  int rc = SQLITE_OK;

  pList = (PendingList *)fts3HashFind(pHash, zToken, nToken);
  if( pList ){
    p->nPendingData -= (pList->nData + nToken + sizeof(Fts3HashElem));
  }
  if( fts3PendingListAppend(&pList, p->iPrevDocid, iCol, iPos, &rc) ){
    if( pList==fts3HashInsert(pHash, zToken, nToken, pList) ){
      /* Malloc failed while inserting the new entry. This can only
      ** happen if there was no previous entry for this token.
      */
      assert( 0==fts3HashFind(pHash, zToken, nToken) );
      sqlite3_free(pList);
      rc = SQLITE_NOMEM;
    }
  }
  if( rc==SQLITE_OK ){
    p->nPendingData += (pList->nData + nToken + sizeof(Fts3HashElem));
  }
  return rc;
}